

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

void llvm::sys::path::replace_extension(SmallVectorImpl<char> *path,Twine *extension,Style style)

{
  anon_unknown_dwarf_44276fd *this;
  long lVar1;
  char *in_start;
  size_t sVar2;
  Style style_00;
  ulong uVar3;
  ulong uVar4;
  StringRef SVar6;
  undefined1 local_70 [8];
  SmallString<32U> ext_storage;
  char local_31;
  ulong uVar5;
  
  this = (anon_unknown_dwarf_44276fd *)
         (path->super_SmallVectorTemplateBase<char,_true>).
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_70 = (undefined1  [8])
             &ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
  style_00 = windows;
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  SVar6 = Twine::toStringRef(extension,(SmallVectorImpl<char> *)local_70);
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       SVar6.Length;
  in_start = SVar6.Data;
  uVar5 = uVar3;
  do {
    uVar4 = uVar5 - 1;
    if (uVar5 == 0) {
      uVar4 = 0xffffffffffffffff;
      break;
    }
    lVar1 = uVar5 - 1;
    uVar5 = uVar4;
  } while (this[lVar1] != (anon_unknown_dwarf_44276fd)0x2e);
  if ((uVar4 != 0xffffffffffffffff) &&
     (SVar6.Length._0_4_ = style, SVar6.Data = (char *)uVar3, SVar6.Length._4_4_ = 0,
     sVar2 = anon_unknown.dwarf_44276fd::filename_pos(this,SVar6,style_00), sVar2 <= uVar4)) {
    if ((path->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar4) {
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (path->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = (uint)uVar4;
  }
  if ((ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
       _24_8_ != 0) && (*in_start != '.')) {
    local_31 = '.';
    SmallVectorTemplateBase<char,_true>::push_back
              (&path->super_SmallVectorTemplateBase<char,_true>,&local_31);
  }
  SmallVectorImpl<char>::append<char_const*,void>
            (path,in_start,
             in_start +
             ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts
             ._24_8_);
  if (local_70 !=
      (undefined1  [8])
      &ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)local_70);
  }
  return;
}

Assistant:

void replace_extension(SmallVectorImpl<char> &path, const Twine &extension,
                       Style style) {
  StringRef p(path.begin(), path.size());
  SmallString<32> ext_storage;
  StringRef ext = extension.toStringRef(ext_storage);

  // Erase existing extension.
  size_t pos = p.find_last_of('.');
  if (pos != StringRef::npos && pos >= filename_pos(p, style))
    path.set_size(pos);

  // Append '.' if needed.
  if (ext.size() > 0 && ext[0] != '.')
    path.push_back('.');

  // Append extension.
  path.append(ext.begin(), ext.end());
}